

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O2

Lpk_Fun_t * Lpk_MuxSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,int Var,int Pol)

{
  undefined1 *pIn;
  char *pOut;
  undefined4 uVar1;
  uint uVar2;
  Lpk_Fun_t *p_00;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pTruth;
  long lVar8;
  uint uVar9;
  char *pOut_00;
  uint uVar10;
  
  uVar2 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  bVar4 = (sbyte)uVar2 - 5;
  if (uVar2 < 6) {
    bVar4 = 0;
  }
  if ((Var < 0) || (uVar2 <= (uint)Var)) {
    __assert_fail("Var >= 0 && Var < (int)p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xac,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((*(uint *)&p->field_0x8 & 0x3ffe0000) == 0) {
    __assert_fail("p->nAreaLim >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xad,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((-1 << (sbyte)uVar2 ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xae,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  pIn = &p->field_0xe4;
  pOut_00 = p->pFanins + (ulong)(uint)(1 << (bVar4 & 0x1f)) * 4 + 0x10;
  pOut = p->pFanins + (ulong)(uint)(2 << (bVar4 & 0x1f)) * 4 + 0x10;
  Kit_TruthCofactor0New((uint *)pOut_00,(uint *)pIn,uVar2,Var);
  Kit_TruthCofactor1New((uint *)pOut,(uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  pTruth = pOut;
  pcVar7 = pOut_00;
  if (Pol == 0) {
    pTruth = pOut_00;
    pcVar7 = pOut;
  }
  p_00 = Lpk_FunDup(p,(uint *)pcVar7);
  uVar2 = Kit_TruthSupport((uint *)pTruth,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar2 = uVar2 | 1 << (Var & 0x1fU);
  p->uSupp = uVar2;
  for (uVar5 = 0;
      (uVar10 = 0xffffffff, uVar5 != 0x20 && (uVar10 = uVar5, (uVar2 >> (uVar5 & 0x1f) & 1) != 0));
      uVar5 = uVar5 + 1) {
  }
  uVar5 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  if ((int)uVar5 <= (int)uVar10) {
    __assert_fail("iVarVac < (int)p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xc0,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  p->uSupp = uVar2 | 1 << (uVar10 & 0x1f);
  uVar3 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
  if (uVar5 < 6) {
    uVar3 = 1;
  }
  lVar8 = (long)(int)uVar10;
  if ((int)uVar10 < 5) {
    uVar1 = *(undefined4 *)(&DAT_007f9e90 + lVar8 * 4);
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)(pIn + uVar6 * 4) = uVar1;
    }
  }
  else {
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      *(uint *)(pIn + uVar6 * 4) = -(uint)((1 << ((char)uVar10 - 5U & 0x1f) & (uint)uVar6) != 0);
    }
  }
  pcVar7 = pIn;
  if (Pol != 0) {
    pcVar7 = pOut;
    pOut_00 = pIn;
  }
  Kit_TruthMuxVar((uint *)pIn,(uint *)pOut_00,(uint *)pcVar7,uVar5,Var);
  uVar2 = p->uSupp;
  uVar5 = Kit_TruthSupport((uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar2 == uVar5) {
    p->pFanins[lVar8] = p_00->field_0x8 & 0x7f;
    p->pDelays[lVar8] = p->nDelayLim - 1;
    p->field_0xb = p->field_0xb & 0xbf;
    Lpk_FunSuppMinimize(p);
    Lpk_FunSuppMinimize(p_00);
    p_00->nDelayLim = p->nDelayLim - 1;
    uVar2 = *(uint *)&p_00->field_0x8;
    uVar5 = uVar2 >> 7 & 0x1f;
    if ((uVar2 >> 0xc & 0xf) < uVar5) {
      uVar10 = *(uint *)&p->field_0x8;
      uVar9 = uVar10 >> 7 & 0x1f;
      if ((uVar10 >> 0xc & 0xf) < uVar9) {
        if (uVar9 < uVar5) {
          *(uint *)&p_00->field_0x8 =
               uVar2 & 0xc000ffff | (uVar10 & 0x10000) + (uVar10 >> 1 & 0x1fff0000);
          uVar5 = *(uint *)&p->field_0x8;
          uVar2 = (((int)(uVar5 << 0xf) >> 0x1f) + (uVar5 >> 0x11 & 0x1fff) & 0x3fff) << 0x10;
        }
        else {
          *(uint *)&p_00->field_0x8 =
               uVar2 & 0xc000ffff |
               (((int)(uVar10 << 0xf) >> 0x1f) + (uVar10 >> 0x11 & 0x1fff) & 0x3fff) << 0x10;
          uVar5 = *(uint *)&p->field_0x8;
          uVar2 = (uVar5 & 0x10000) + (uVar5 >> 1 & 0x1fff0000);
        }
        uVar2 = uVar5 & 0xc000ffff | uVar2;
      }
      else {
        *(uint *)&p_00->field_0x8 = uVar2 & 0xc000ffff | uVar10 + 0x3fff0000 & 0x3fff0000;
        uVar2 = *(uint *)&p->field_0x8 & 0xc000ffff | 0x10000;
      }
    }
    else {
      *(uint *)&p_00->field_0x8 = uVar2 & 0xc000ffff | 0x10000;
      uVar2 = *(uint *)&p->field_0x8 & 0xc000ffff | *(uint *)&p->field_0x8 + 0x3fff0000 & 0x3fff0000
      ;
    }
    *(uint *)&p->field_0x8 = uVar2;
    p_00->field_0xb = p_00->field_0xb | 0x80;
    return p_00;
  }
  __assert_fail("p->uSupp == Kit_TruthSupport(pTruth, p->nVars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                ,199,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
}

Assistant:

Lpk_Fun_t * Lpk_MuxSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, int Var, int Pol )
{
    Lpk_Fun_t * pNew;
    unsigned * pTruth  = Lpk_FunTruth( p, 0 );
    unsigned * pTruth0 = Lpk_FunTruth( p, 1 );
    unsigned * pTruth1 = Lpk_FunTruth( p, 2 );
//    unsigned uSupp;
    int iVarVac; 
    assert( Var >= 0 && Var < (int)p->nVars );
    assert( p->nAreaLim >= 2 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    Kit_TruthCofactor0New( pTruth0, pTruth, p->nVars, Var );
    Kit_TruthCofactor1New( pTruth1, pTruth, p->nVars, Var );
/*
uSupp = Kit_TruthSupport( pTruth, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth0, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth1, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n\n" );
*/
    // derive the new component
    pNew = Lpk_FunDup( p, Pol ? pTruth0 : pTruth1 );
    // update the support of the old component
    p->uSupp  = Kit_TruthSupport( Pol ? pTruth1 : pTruth0, p->nVars );
    p->uSupp |= (1 << Var);
    // update the truth table of the old component
    iVarVac = Kit_WordFindFirstBit( ~p->uSupp );
    assert( iVarVac < (int)p->nVars );
    p->uSupp |= (1 << iVarVac);
    Kit_TruthIthVar( pTruth, p->nVars, iVarVac );
    if ( Pol )
        Kit_TruthMuxVar( pTruth, pTruth, pTruth1, p->nVars, Var );
    else
        Kit_TruthMuxVar( pTruth, pTruth0, pTruth, p->nVars, Var );
    assert( p->uSupp == Kit_TruthSupport(pTruth, p->nVars) );
    // set the decomposed variable
    p->pFanins[iVarVac] = pNew->Id;
    p->pDelays[iVarVac] = p->nDelayLim - 1;
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->nDelayLim - 1;
    if ( pNew->nVars <= pNew->nLutK )
    {
        pNew->nAreaLim = 1;
        p->nAreaLim = p->nAreaLim - 1;
    }
    else if ( p->nVars <= p->nLutK )
    {
        pNew->nAreaLim = p->nAreaLim - 1;
        p->nAreaLim = 1;
    }
    else if ( p->nVars < pNew->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
    }
    else // if ( pNew->nVars < p->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
    }
    pNew->fMark = 1;
    return pNew;
}